

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSpaceTest.cpp
# Opt level: O3

void __thiscall RealTransport::test_method(RealTransport *this)

{
  double *pdVar1;
  bool bVar2;
  Index outer_stride;
  undefined **ppuVar3;
  undefined8 *puVar4;
  char *__function;
  Index rows_1;
  VectorXd x;
  VectorXd v;
  MatrixXd H;
  MatrixXd expectedRes;
  RealSpace Space;
  undefined **local_2f8;
  void *local_2f0;
  undefined **local_2e8;
  void *local_2e0;
  undefined **local_2d8;
  void *local_2d0;
  shared_count sStack_2c8;
  void *local_2c0;
  undefined8 uStack_2b8;
  void *local_2b0;
  long local_2a8;
  long local_2a0;
  Matrix<double,__1,__1,_0,__1,__1> local_298;
  Matrix<double,__1,__1,_0,__1,__1> local_280;
  undefined **local_268;
  char *local_260;
  void *local_250;
  undefined8 uStack_248;
  RealScalar local_240;
  double *local_238;
  undefined **local_230;
  undefined8 local_228;
  undefined **local_220;
  undefined **local_210;
  void *local_208;
  undefined **local_1f8;
  void *pvStack_1f0;
  undefined8 *local_1e8;
  undefined ***pppuStack_1e0;
  undefined8 uStack_1d8;
  void *local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  char *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  code *local_98 [11];
  void *local_40;
  void *local_30;
  
  mnf::RealSpace::RealSpace((RealSpace *)local_98,7);
  ppuVar3 = (undefined **)mnf::Manifold::dim();
  pvStack_1f0 = (void *)0x5;
  local_1f8 = ppuVar3;
  if ((long)ppuVar3 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_random_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_2b0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_1f8);
  local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  if ((undefined **)0x1999999999999999 < ppuVar3) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = std::ostream::_M_insert<long>;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if (ppuVar3 != (undefined **)0x0) {
    local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         Eigen::internal::conditional_aligned_new_auto<double,true>((long)ppuVar3 * 5);
  }
  pdVar1 = local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 5;
  local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)ppuVar3;
  local_1f8 = ppuVar3;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2e8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_1f8);
  mnf::Manifold::getZero();
  mnf::SubPoint::value();
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_2f8,
             (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
              *)&local_2d8);
  mnf::ConstSubPoint::~ConstSubPoint((ConstSubPoint *)&pppuStack_1e0);
  free(pvStack_1f0);
  local_210 = local_2f8;
  local_208 = local_2f0;
  if ((long)local_2f0 < 0 && local_2f8 != (undefined **)0x0) {
    __function = 
    "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  else {
    pppuStack_1e0 = (undefined ***)0x0;
    uStack_1d8 = 0;
    local_1f8 = local_2f8;
    pvStack_1f0 = local_2f0;
    local_2c0 = (void *)0x0;
    uStack_2b8 = 0;
    local_2d8 = local_2e8;
    local_2d0 = local_2e0;
    if (-1 < (long)local_2e0 || local_2e8 == (undefined **)0x0) {
      mnf::Manifold::retractation(local_98,&local_210,&local_1f8,&local_2d8);
      free(local_2c0);
      free(pppuStack_1e0);
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           Eigen::internal::conditional_aligned_new_auto<double,true>(local_2a0 * local_2a8);
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           local_2a8;
      local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           local_2a0;
      if (local_2a0 * local_2a8 != 0) {
        memcpy(local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data,local_2b0,local_2a0 * local_2a8 * 8);
      }
      local_228 = 5;
      local_1e8 = (undefined8 *)0x0;
      pppuStack_1e0 = (undefined ***)0x0;
      local_1f8 = (undefined **)0x0;
      pvStack_1f0 = (void *)0x0;
      local_1d0 = (void *)0x0;
      uStack_1c8 = 0;
      local_1c0 = 0;
      local_238 = pdVar1;
      local_230 = ppuVar3;
      local_220 = ppuVar3;
      Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>const,0,Eigen::OuterStride<-1>>::
      construct<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                ((Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>const,0,Eigen::OuterStride<_1>> *)
                 &local_1f8,&local_2b0);
      local_2c0 = (void *)0x0;
      uStack_2b8 = 0;
      local_2d8 = local_2f8;
      local_2d0 = local_2f0;
      if (-1 < (long)local_2f0 || local_2f8 == (undefined **)0x0) {
        local_250 = (void *)0x0;
        uStack_248 = 0;
        local_268 = local_2e8;
        local_260 = (char *)local_2e0;
        if (-1 < (long)local_2e0 || local_2e8 == (undefined **)0x0) {
          mnf::Manifold::applyTransport(local_98,&local_238,&local_1f8,&local_2d8,&local_268);
          free(local_250);
          free(local_2c0);
          free(local_1d0);
          local_a8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
          ;
          local_a0 = "";
          local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a8,0xbb);
          local_240 = 1e-12;
          bVar2 = Eigen::internal::
                  isApprox_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false>
                  ::run(&local_280,&local_298,&local_240);
          local_2d8 = (undefined **)CONCAT71(local_2d8._1_7_,bVar2);
          local_2d0 = (void *)0x0;
          sStack_2c8.pi_ = (sp_counted_base *)0x0;
          local_268 = (undefined **)0x121580;
          local_260 = "";
          pvStack_1f0 = (void *)((ulong)pvStack_1f0 & 0xffffffffffffff00);
          local_1f8 = &PTR__lazy_ostream_0012bc88;
          local_1e8 = &boost::unit_test::lazy_ostream::inst;
          local_c8 = 
          "/workspace/llm4binary/github/license_all_cmakelists_25/stanislas-brossette[P]manifolds/tests/RealSpaceTest.cpp"
          ;
          local_c0 = "";
          pppuStack_1e0 = &local_268;
          boost::test_tools::tt_detail::report_assertion();
          boost::detail::shared_count::~shared_count(&sStack_2c8);
          free(local_280.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_2f8);
          free(local_2e8);
          free(local_298.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
               m_data);
          free(local_2b0);
          local_98[0] = std::terminate;
          free(local_30);
          free(local_40);
          mnf::Manifold::~Manifold((Manifold *)local_98);
          return;
        }
      }
    }
    uStack_2b8 = 0;
    local_2c0 = (void *)0x0;
    __function = 
    "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,__function);
}

Assistant:

BOOST_AUTO_TEST_CASE(RealTransport)
{
  int c = 5;
  RealSpace Space(7);
  Index dim = Space.dim();
  Eigen::MatrixXd H = Eigen::MatrixXd::Random(dim, c);
  Eigen::MatrixXd Hout(dim, c);
  Eigen::VectorXd v = Eigen::VectorXd::Random(dim);
  Eigen::VectorXd x = Space.getZero().value();
  Space.retractation(x, x, v);
  Eigen::MatrixXd expectedRes = H;
  Space.applyTransport(Hout, H, x, v);
  BOOST_CHECK(expectedRes.isApprox(Hout));
}